

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<google::protobuf::json_internal::UntypedMessage&&>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<const_int_&> *args_1,
          tuple<google::protobuf::json_internal::UntypedMessage_&&> *args_2)

{
  iterator i;
  bool bVar1;
  slot_type *slot;
  reference ts;
  const_iterator local_60;
  FindElement local_50;
  iterator local_48;
  tuple<google::protobuf::json_internal::UntypedMessage_&&> *local_38;
  tuple<google::protobuf::json_internal::UntypedMessage_&&> *args_local_2;
  tuple<const_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  raw_hash_set<_2385b75b_> *this_local;
  iterator iter_local;
  
  iter_local.ctrl_ = (ctrl_t *)iter.field_1;
  this_local = (raw_hash_set<_2385b75b_> *)iter.ctrl_;
  local_38 = args_2;
  args_local_2 = (tuple<google::protobuf::json_internal::UntypedMessage_&&> *)args_1;
  args_local_1 = (tuple<const_int_&> *)args;
  args_local = (piecewise_construct_t *)this;
  slot = raw_hash_set<$2385b75b$>::iterator::slot((iterator *)&this_local);
  construct<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<google::protobuf::json_internal::UntypedMessage&&>>
            (this,slot,(piecewise_construct_t *)args_local_1,(tuple<const_int_&> *)args_local_2,
             local_38);
  local_50.s = (raw_hash_set<_2385b75b_> *)this;
  ts = raw_hash_set<$2385b75b$>::iterator::operator*((iterator *)&this_local);
  local_48 = (iterator)
             hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,void>
             ::
             apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pai___f::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>
                       (&local_50,ts);
  i.field_1.slot_ = (slot_type *)iter_local.ctrl_;
  i.ctrl_ = (ctrl_t *)this_local;
  raw_hash_set<$2385b75b$>::const_iterator::const_iterator(&local_60,i);
  bVar1 = container_internal::operator==((const_iterator *)&local_48,&local_60);
  if (!bVar1) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf3f,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf::json_internal::UntypedMessage, std::vector<google::protobuf::json_internal::UntypedMessage::Bool>, std::vector<int>, std::vector<unsigned int>, std::vector<long>, std::vector<unsigned long>, std::vector<float>, std::vector<double>, std::vector<std::basic_string<char>>, std::vector<google::protobuf::json_internal::UntypedMessage>>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf::json_internal::UntypedMessage, std::vector<google::protobuf::json_internal::UntypedMessage::Bool>, std::vector<int>, std::vector<unsigned int>, std::vector<long>, std::vector<unsigned long>, std::vector<float>, std::vector<double>, std::vector<std::basic_string<char>>, std::vector<google::protobuf::json_internal::UntypedMessage>>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf::json_internal::UntypedMessage, std::vector<google::protobuf::json_internal::UntypedMessage::Bool>, std::vector<int>, std::vector<unsigned int>, std::vector<long>, std::vector<unsigned long>, std::vector<float>, std::vector<double>, std::vector<std::basic_string<char>>, std::vector<google::protobuf::json_internal::UntypedMessage>>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::variant<google::protobuf::json_internal::UntypedMessage::Bool, int, unsigned int, long, unsigned long, float, double, std::basic_string<char>, google::protobuf:..." /* TRUNCATED STRING LITERAL */
                 );
  }
  return;
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }